

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

Maybe<kj::Own<capnp::_::SegmentReader>_&> __thiscall
kj::HashMap<unsigned_int,kj::Own<capnp::_::SegmentReader>>::find<unsigned_int&>
          (HashMap<unsigned_int,kj::Own<capnp::_::SegmentReader>> *this,uint *key)

{
  Maybe<kj::Own<capnp::_::SegmentReader>_&> MVar1;
  anon_class_1_0_00000001 local_29;
  Maybe<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_>::Entry_&> local_28;
  uint *local_20;
  uint *key_local;
  HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_> *this_local;
  
  local_20 = key;
  key_local = (uint *)this;
  local_28 = Table<kj::HashMap<unsigned_int,kj::Own<capnp::_::SegmentReader>>::Entry,kj::HashIndex<kj::HashMap<unsigned_int,kj::Own<capnp::_::SegmentReader>>::Callbacks>>
             ::find<0ul,unsigned_int&>
                       ((Table<kj::HashMap<unsigned_int,kj::Own<capnp::_::SegmentReader>>::Entry,kj::HashIndex<kj::HashMap<unsigned_int,kj::Own<capnp::_::SegmentReader>>::Callbacks>>
                         *)this,key);
  MVar1 = Maybe<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_>::Entry_&>::
          map<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj____kj_map_h:358:30)>
                    (&local_28,&local_29);
  return (Maybe<kj::Own<capnp::_::SegmentReader>_&>)MVar1.ptr;
}

Assistant:

kj::Maybe<Value&> HashMap<Key, Value>::find(KeyLike&& key) {
  return table.find(key).map([](Entry& e) -> Value& { return e.value; });
}